

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeWindowSettings(ImGuiWindowSettings *settings)

{
  if (settings->WantDelete == true) {
    BeginDisabled(true);
  }
  Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)settings->ID,settings + 1,
       (ulong)(uint)(int)(settings->Pos).x,(ulong)(uint)(int)(settings->Pos).y,
       (ulong)(uint)(int)(settings->Size).x,(ulong)(uint)(int)(settings->Size).y,
       (ulong)settings->Collapsed);
  if (settings->WantDelete == true) {
    EndDisabled();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindowSettings(ImGuiWindowSettings* settings)
{
    if (settings->WantDelete)
        BeginDisabled();
    Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",
        settings->ID, settings->GetName(), settings->Pos.x, settings->Pos.y, settings->Size.x, settings->Size.y, settings->Collapsed);
    if (settings->WantDelete)
        EndDisabled();
}